

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

char * __thiscall asmjit::v1_14::String::prepare(String *this,ModifyOp op,size_t size)

{
  String *pSVar1;
  String SVar2;
  String *__ptr;
  String *pSVar3;
  ulong uVar4;
  String *pSVar5;
  void *__dest;
  String *__src;
  char *__dest_00;
  String *size_00;
  size_t sVar6;
  char *__s;
  char *pcVar7;
  String *this_00;
  
  SVar2 = *this;
  this_00 = (String *)(ulong)(byte)SVar2;
  __ptr = *(String **)(this + 0x18);
  if (this_00 < (String *)0x1f) {
    __src = this + 1;
    pSVar3 = (String *)0x1e;
  }
  else {
    pSVar3 = *(String **)(this + 0x10);
    this_00 = *(String **)(this + 8);
    __src = __ptr;
  }
  if (op == kAssign) {
    if (pSVar3 < size) {
      if (0xfffffffffefffffe < size) {
        return (char *)0x0;
      }
      __src = (String *)malloc((size & 0xffffffffffffff80) + 0x80);
      if (__src == (String *)0x0) {
        return (char *)0x0;
      }
      if (SVar2 == (String)0x1f) {
        free(__ptr);
      }
      *this = (String)0x1f;
      *(size_t *)(this + 8) = size;
      *(size_t *)(this + 0x10) = size | 0x7f;
      *(String **)(this + 0x18) = __src;
    }
    else if ((byte)SVar2 < 0x1f) {
      *this = SUB81(size,0);
    }
    else {
      *(size_t *)(this + 8) = size;
    }
    __src[size] = (String)0x0;
    return (char *)__src;
  }
  size_00 = (String *)(-(long)this_00 - 0x1000002);
  if (size_00 <= size) {
    return (char *)0x0;
  }
  pSVar1 = this_00 + size;
  if (pSVar1 <= pSVar3) {
    if ((byte)SVar2 < 0x1f) {
      *this = SUB81(pSVar1,0);
    }
    else {
      *(String **)(this + 8) = pSVar1;
    }
    __src[(long)pSVar1] = (String)0x0;
    return (char *)(__src + (long)this_00);
  }
  pSVar3 = pSVar1 + 1;
  if (pSVar3 < (String *)0xfffffffffeffffff) {
    sVar6 = 0x1ff;
    if (0x1ff < size) {
      sVar6 = size;
    }
    pSVar5 = (String *)0x80;
    if (0x7e < size) {
      pSVar5 = (String *)(sVar6 + 1);
    }
    if (pSVar5 < pSVar3) {
      uVar4 = (ulong)pSVar1 >> 1 | (ulong)pSVar1;
      uVar4 = uVar4 >> 2 | uVar4;
      uVar4 = uVar4 >> 4 | uVar4;
      uVar4 = uVar4 >> 8 | uVar4;
      uVar4 = uVar4 >> 0x10 | uVar4;
      pSVar5 = (String *)((uVar4 >> 0x20 | uVar4) + 1);
      size_00 = pSVar3;
      if (pSVar5 < pSVar3) goto LAB_0012960a;
      if ((String *)0x1000000 < pSVar5) {
        pSVar5 = pSVar3 + ((uint)pSVar3 & 0xffffff);
      }
    }
    size_00 = (String *)0xfffffffffeffffff;
    if (pSVar5 < (String *)0xfffffffffeffffff) {
      size_00 = pSVar5;
    }
    if (pSVar3 <= size_00) {
LAB_0012960a:
      __dest = malloc((size_t)size_00);
      if (__dest == (void *)0x0) {
        return (char *)0x0;
      }
      memcpy(__dest,__src,(size_t)this_00);
      if (SVar2 == (String)0x1f) {
        free(__ptr);
      }
      *this = (String)0x1f;
      *(String **)(this + 8) = pSVar1;
      *(String **)(this + 0x10) = size_00 + -1;
      *(void **)(this + 0x18) = __dest;
      *(String *)((long)__dest + (long)pSVar1) = (String)0x0;
      return (char *)(String *)((long)__dest + (long)this_00);
    }
  }
  else {
    prepare();
  }
  prepare();
  if (size_00 == (String *)0xffffffffffffffff) {
    if (__s == (char *)0x0) {
      return (char *)0x0;
    }
    size_00 = (String *)strlen(__s);
  }
  pcVar7 = (char *)0x0;
  if (size_00 != (String *)0x0) {
    __dest_00 = prepare(this_00,op,(size_t)size_00);
    if (__dest_00 == (char *)0x0) {
      pcVar7 = (char *)0x1;
    }
    else {
      memcpy(__dest_00,__s,(size_t)size_00);
    }
  }
  return pcVar7;
}

Assistant:

char* String::prepare(ModifyOp op, size_t size) noexcept {
  char* curData;
  size_t curSize;
  size_t curCapacity;

  if (isLargeOrExternal()) {
    curData = _large.data;
    curSize = _large.size;
    curCapacity = _large.capacity;
  }
  else {
    curData = _small.data;
    curSize = _small.type;
    curCapacity = kSSOCapacity;
  }

  if (op == ModifyOp::kAssign) {
    if (size > curCapacity) {
      // Prevent arithmetic overflow.
      if (ASMJIT_UNLIKELY(size >= kMaxAllocSize))
        return nullptr;

      size_t newCapacity = Support::alignUp<size_t>(size + 1, kMinAllocSize);
      char* newData = static_cast<char*>(::malloc(newCapacity));

      if (ASMJIT_UNLIKELY(!newData))
        return nullptr;

      if (_type == kTypeLarge)
        ::free(curData);

      _large.type = kTypeLarge;
      _large.size = size;
      _large.capacity = newCapacity - 1;
      _large.data = newData;

      newData[size] = '\0';
      return newData;
    }
    else {
      _setSize(size);
      curData[size] = '\0';
      return curData;
    }
  }
  else {
    // Prevent arithmetic overflow.
    if (ASMJIT_UNLIKELY(size >= kMaxAllocSize - curSize - 1))
      return nullptr;

    size_t newSize = size + curSize;
    size_t newSizePlusOne = newSize + 1;

    if (newSize > curCapacity) {
      size_t newCapacityPlusOne = String_growCapacity(size + 1u, newSizePlusOne);
      ASMJIT_ASSERT(newCapacityPlusOne >= newSizePlusOne);

      if (ASMJIT_UNLIKELY(newCapacityPlusOne < newSizePlusOne))
        return nullptr;

      char* newData = static_cast<char*>(::malloc(newCapacityPlusOne));
      if (ASMJIT_UNLIKELY(!newData))
        return nullptr;

      memcpy(newData, curData, curSize);

      if (_type == kTypeLarge)
        ::free(curData);

      _large.type = kTypeLarge;
      _large.size = newSize;
      _large.capacity = newCapacityPlusOne - 1;
      _large.data = newData;

      newData[newSize] = '\0';
      return newData + curSize;
    }
    else {
      _setSize(newSize);
      curData[newSize] = '\0';
      return curData + curSize;
    }
  }
}